

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratrecon.hpp
# Opt level: O1

bool soplex::reconstructVector(VectorRational *input,Rational *denomBoundSquared,DIdxSet *indexSet)

{
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  *o;
  data_type *this;
  pointer pnVar1;
  char cVar2;
  int iVar3;
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  *pcVar4;
  data_type *pdVar5;
  undefined8 uVar6;
  uint uVar7;
  byte bVar8;
  long lVar9;
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  *pnVar10;
  ulong *__src;
  int iVar11;
  pointer pnVar12;
  Rational *__src_00;
  bool *pbVar13;
  undefined8 uVar14;
  pointer pnVar15;
  ulong uVar16;
  Rational *pRVar17;
  Integer q [3];
  Integer temp;
  Integer denom;
  Integer tn;
  Integer p [3];
  Integer ai;
  Integer td;
  Integer Dbound;
  Integer gcd;
  Integer a0;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  xnum;
  data_type local_418;
  uint local_408;
  undefined2 local_404;
  char local_402;
  undefined1 local_3f8 [16];
  uint local_3e8;
  undefined2 local_3e4;
  bool local_3e2 [4];
  undefined4 uStack_3de;
  undefined2 uStack_3da;
  data_type local_3d8;
  uint local_3c8;
  undefined2 local_3c4;
  bool local_3c2 [10];
  undefined1 local_3b8 [16];
  uint local_3a8;
  char local_3a4;
  char local_3a3;
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  local_398;
  ulong local_378;
  VectorRational *local_370;
  data_type local_368;
  int local_358;
  undefined2 local_354;
  char local_352;
  data_type local_348;
  uint local_338;
  undefined2 local_334;
  byte local_332;
  ulong local_320;
  undefined1 local_318 [16];
  uint local_308;
  undefined2 local_304;
  bool local_302 [4];
  undefined4 uStack_2fe;
  undefined2 uStack_2fa;
  data_type local_2f8;
  uint local_2e8;
  undefined1 local_2e4;
  bool abStack_2e3 [19];
  bool *local_2d0;
  uint local_2c8;
  undefined1 local_2c4;
  char local_2c3;
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  local_2b8;
  data_type local_298;
  int local_288;
  undefined2 local_284;
  char local_282;
  data_type local_278;
  uint local_268;
  undefined2 local_264;
  byte local_262;
  data_type local_258;
  uint local_248;
  undefined2 local_244;
  char local_242;
  DIdxSet *local_230;
  data_type local_228;
  uint local_218;
  undefined2 local_214;
  byte local_212;
  ulong local_200;
  data_type local_1f8;
  int local_1e8;
  undefined2 local_1e4;
  char local_1e2;
  Rational *local_1d0;
  data_type local_1c8;
  uint local_1b8;
  undefined1 local_1b4;
  byte local_1b3;
  byte local_1b2;
  data_type local_1a8;
  uint local_198;
  undefined1 local_194;
  byte local_193;
  byte local_192;
  data_type local_188;
  uint local_178;
  undefined1 local_174;
  byte local_173;
  byte local_172;
  data_type local_168;
  uint local_158;
  undefined1 local_154;
  byte local_153;
  byte local_152;
  data_type local_148;
  uint local_138;
  undefined1 local_134;
  byte local_133;
  byte local_132;
  data_type local_128;
  uint local_118;
  undefined1 local_114;
  byte local_113;
  byte local_112;
  data_type local_108;
  uint local_f8;
  undefined1 local_f4;
  byte local_f3;
  byte local_f2;
  data_type local_e8;
  uint local_d8;
  undefined1 local_d4;
  byte local_d3;
  byte local_d2;
  data_type local_c8;
  uint local_b8;
  undefined1 local_b4;
  byte local_b3;
  byte local_b2;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  local_a0;
  data_type local_88;
  char local_73;
  char local_72;
  uint local_68 [2];
  void *local_60;
  char local_53;
  char local_52;
  long local_48;
  expression<boost::multiprecision::detail::negate,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void,_void>
  local_40;
  expression<boost::multiprecision::detail::negate,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void,_void>
  local_38;
  
  local_1d0 = denomBoundSquared;
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::vector(&local_a0,
           (long)(int)((ulong)((long)(input->val).
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(input->val).
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 6),
           (allocator_type *)&local_2f8.ld);
  local_348.la[0] = 1;
  local_338 = 1;
  local_334 = 0x100;
  local_332 = 0;
  local_320 = (ulong)((long)(input->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(input->val).
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 6;
  local_370 = input;
  local_230 = indexSet;
  if (indexSet == (DIdxSet *)0x0) {
    uVar7 = (uint)local_320;
    if (0 < (int)uVar7) {
      uVar16 = (ulong)(uVar7 & 0x7fffffff);
      lVar9 = 0x20;
      do {
        local_c8.la[0] = 0;
        local_b8 = 0;
        if (local_332 != 0) {
          local_b8 = local_338;
        }
        local_b4 = (undefined1)local_334;
        local_b3 = local_332 ^ 1;
        local_b2 = local_332;
        if (local_332 == 1) {
          local_c8.la[0] = local_348.la[0];
          local_c8.ld.data = local_348.ld.data;
        }
        else {
          boost::multiprecision::backends::
          cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    *)&local_c8.ld,local_338,local_338);
          uVar6 = &local_c8;
          if (local_b3 == 0) {
            uVar6 = local_c8.ld.data;
          }
          uVar14 = &local_348;
          if (local_334._1_1_ == '\0') {
            uVar14 = local_348.ld.data;
          }
          memcpy((void *)uVar6,(void *)uVar14,(ulong)local_338 << 3);
        }
        pnVar1 = (local_370->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __src = (ulong *)((long)&(pnVar1->m_backend).m_value + lVar9);
        local_e8.la[0] = 0;
        local_d2 = *(byte *)((long)&(pnVar1->m_backend).m_value + lVar9 + 0x16);
        uVar7 = *(uint *)((long)&(pnVar1->m_backend).m_value + lVar9 + 0x10);
        local_d8 = 0;
        if (local_d2 != 0) {
          local_d8 = uVar7;
        }
        local_d4 = *(undefined1 *)((long)&(pnVar1->m_backend).m_value + lVar9 + 0x14);
        local_d3 = local_d2 ^ 1;
        if (local_d2 == 1) {
          local_e8.la[0] = *__src;
          local_e8.ld.data = (limb_pointer)__src[1];
        }
        else {
          boost::multiprecision::backends::
          cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    *)&local_e8.ld,uVar7,uVar7);
          uVar6 = &local_e8;
          if (local_d3 == 0) {
            uVar6 = local_e8.ld.data;
          }
          if (*(char *)((long)&(pnVar1->m_backend).m_value + lVar9 + 0x15) == '\0') {
            __src = *(ulong **)((long)&(pnVar1->m_backend).m_value + lVar9 + 8);
          }
          memcpy((void *)uVar6,__src,
                 (ulong)*(uint *)((long)&(pnVar1->m_backend).m_value + lVar9 + 0x10) << 3);
        }
        boost::multiprecision::default_ops::
        eval_lcm<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                  ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)&local_348.ld,
                   (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)&local_c8.ld,
                   (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)&local_e8.ld);
        uVar7 = (uint)local_320;
        if ((local_d3 == 0) && (local_d2 == 0)) {
          operator_delete(local_e8.ld.data,(local_e8.la[0] & 0xffffffff) << 3);
        }
        if ((local_b3 == 0) && (local_b2 == 0)) {
          operator_delete(local_c8.ld.data,(local_c8.la[0] & 0xffffffff) << 3);
        }
        lVar9 = lVar9 + 0x40;
        uVar16 = uVar16 - 1;
      } while (uVar16 != 0);
    }
    if (0 < (int)uVar7) {
      local_200 = (ulong)((uint)local_320 & 0x7fffffff);
      uVar16 = 0;
      do {
        pnVar12 = (local_370->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar1 = pnVar12 + uVar16;
        local_3d8.la[0] = 0;
        local_3c2[0] = *(bool *)((long)&pnVar12[uVar16].m_backend.m_value + 0x16);
        uVar7 = *(uint *)((long)&pnVar12[uVar16].m_backend.m_value + 0x10);
        local_3c8 = 0;
        if (local_3c2[0] != false) {
          local_3c8 = uVar7;
        }
        local_3c4 = CONCAT11(local_3c2[0],*(bool *)((long)&pnVar12[uVar16].m_backend.m_value + 0x14)
                            ) ^ 0x100;
        if (local_3c2[0] == true) {
          local_3d8.la[0] = *(undefined8 *)&(pnVar1->m_backend).m_value;
          local_3d8.ld.data = (limb_pointer)*(undefined8 *)((long)&(pnVar1->m_backend).m_value + 8);
        }
        else {
          boost::multiprecision::backends::
          cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    *)&local_3d8.ld,uVar7,uVar7);
          uVar6 = &local_3d8;
          if (local_3c4._1_1_ == '\0') {
            uVar6 = local_3d8.ld.data;
          }
          pnVar12 = pnVar1;
          if (*(bool *)((long)&(pnVar1->m_backend).m_value + 0x15) == false) {
            pnVar12 = *(pointer *)((long)&(pnVar1->m_backend).m_value + 8);
          }
          memcpy((void *)uVar6,pnVar12,
                 (ulong)*(uint *)((long)&(pnVar1->m_backend).m_value + 0x10) << 3);
        }
        local_418.la[0] = (limb_type)&local_348;
        local_418.ld.data = (limb_pointer)&local_3d8;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
        ::
        number<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,void,void>
                  ((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
                    *)&local_2f8.ld,
                   (expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)&local_418.ld,(type *)0x0);
        local_378 = uVar16;
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)(local_a0.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar16),
                    (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)&local_2f8.ld);
        if ((abStack_2e3[0] == false) && (abStack_2e3[1] == false)) {
          operator_delete(local_2f8.ld.data,(local_2f8.la[0] & 0xffffffff) << 3);
        }
        if ((local_3c4._1_1_ == '\0') && (local_3c2[0] == false)) {
          operator_delete(local_3d8.ld.data,(local_3d8.la[0] & 0xffffffff) << 3);
        }
        pnVar15 = local_a0.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar16;
        pnVar1 = (local_370->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar10 = (number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                   *)((long)&pnVar1[uVar16].m_backend.m_value + 0x20);
        local_3d8.la[0] = 0;
        local_3c2[0] = *(bool *)((long)&pnVar1[uVar16].m_backend.m_value + 0x36);
        uVar7 = *(uint *)((long)&pnVar1[uVar16].m_backend.m_value + 0x30);
        local_3c8 = 0;
        if (local_3c2[0] != false) {
          local_3c8 = uVar7;
        }
        local_3c4 = CONCAT11(local_3c2[0],*(bool *)((long)&pnVar1[uVar16].m_backend.m_value + 0x34))
                    ^ 0x100;
        if (local_3c2[0] == true) {
          local_3d8.la[0] =
               *(undefined8 *)
                &(pnVar10->m_backend).
                 super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          ;
          local_3d8.ld.data =
               (limb_pointer)*(undefined8 *)((long)&pnVar1[uVar16].m_backend.m_value + 0x28);
        }
        else {
          boost::multiprecision::backends::
          cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    *)&local_3d8.ld,uVar7,uVar7);
          uVar6 = &local_3d8;
          if (local_3c4._1_1_ == '\0') {
            uVar6 = local_3d8.ld.data;
          }
          if (*(bool *)((long)&pnVar1[uVar16].m_backend.m_value + 0x35) == false) {
            pnVar10 = *(number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                        **)((long)&pnVar1[uVar16].m_backend.m_value + 0x28);
          }
          memcpy((void *)uVar6,pnVar10,
                 (ulong)*(uint *)((long)&pnVar1[uVar16].m_backend.m_value + 0x30) << 3);
        }
        local_418.ld.data = (limb_pointer)&local_3d8;
        local_418.la[0] = (limb_type)pnVar15;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
        ::
        number<boost::multiprecision::detail::divide_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,void,void>
                  ((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
                    *)&local_2f8.ld,
                   (expression<boost::multiprecision::detail::divide_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)&local_418.ld,(type *)0x0);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)(local_a0.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar16),
                    (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)&local_2f8.ld);
        if ((abStack_2e3[0] == false) && (abStack_2e3[1] == false)) {
          operator_delete(local_2f8.ld.data,(local_2f8.la[0] & 0xffffffff) << 3);
        }
        uVar16 = local_378;
        if ((local_3c4._1_1_ == '\0') && (local_3c2[0] == false)) {
          operator_delete(local_3d8.ld.data,(local_3d8.la[0] & 0xffffffff) << 3);
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != local_200);
    }
  }
  else {
    if (0 < (indexSet->super_IdxSet).num) {
      lVar9 = 0;
      do {
        local_108.la[0] = 0;
        local_f8 = 0;
        if (local_332 != 0) {
          local_f8 = local_338;
        }
        local_f4 = (undefined1)local_334;
        local_f3 = local_332 ^ 1;
        local_f2 = local_332;
        if (local_332 == 1) {
          local_108.la[0] = local_348.la[0];
          local_108.ld.data = local_348.ld.data;
        }
        else {
          boost::multiprecision::backends::
          cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    *)&local_108.ld,local_338,local_338);
          uVar6 = &local_108;
          if (local_f3 == 0) {
            uVar6 = local_108.ld.data;
          }
          uVar14 = &local_348;
          if (local_334._1_1_ == '\0') {
            uVar14 = local_348.ld.data;
          }
          memcpy((void *)uVar6,(void *)uVar14,(ulong)local_338 << 3);
        }
        iVar11 = (indexSet->super_IdxSet).idx[lVar9];
        pnVar1 = (local_370->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar10 = (number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                   *)((long)&pnVar1[iVar11].m_backend.m_value + 0x20);
        local_128.la[0] = 0;
        local_112 = *(bool *)((long)&pnVar1[iVar11].m_backend.m_value + 0x36);
        uVar7 = *(uint *)((long)&pnVar1[iVar11].m_backend.m_value + 0x30);
        local_118 = 0;
        if ((bool)local_112 != false) {
          local_118 = uVar7;
        }
        local_114 = *(bool *)((long)&pnVar1[iVar11].m_backend.m_value + 0x34);
        local_113 = local_112 ^ 1;
        if ((bool)local_112 == true) {
          local_128.la[0] =
               *(undefined8 *)
                &(pnVar10->m_backend).
                 super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          ;
          local_128.ld.data =
               (limb_pointer)*(undefined8 *)((long)&pnVar1[iVar11].m_backend.m_value + 0x28);
        }
        else {
          boost::multiprecision::backends::
          cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    *)&local_128.ld,uVar7,uVar7);
          uVar6 = &local_128;
          if (local_113 == 0) {
            uVar6 = local_128.ld.data;
          }
          if (*(bool *)((long)&pnVar1[iVar11].m_backend.m_value + 0x35) == false) {
            pnVar10 = *(number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                        **)((long)&pnVar1[iVar11].m_backend.m_value + 0x28);
          }
          memcpy((void *)uVar6,pnVar10,
                 (ulong)*(uint *)((long)&pnVar1[iVar11].m_backend.m_value + 0x30) << 3);
        }
        boost::multiprecision::default_ops::
        eval_lcm<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                  ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)&local_348.ld,
                   (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)&local_108.ld,
                   (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)&local_128.ld);
        indexSet = local_230;
        if ((local_113 == 0) && (local_112 == 0)) {
          operator_delete(local_128.ld.data,(local_128.la[0] & 0xffffffff) << 3);
        }
        if ((local_f3 == 0) && (local_f2 == 0)) {
          operator_delete(local_108.ld.data,(local_108.la[0] & 0xffffffff) << 3);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < (indexSet->super_IdxSet).num);
    }
    if (0 < (indexSet->super_IdxSet).num) {
      uVar16 = 0;
      do {
        iVar11 = (local_230->super_IdxSet).idx[uVar16];
        pnVar12 = (local_370->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar1 = pnVar12 + iVar11;
        local_3d8.la[0] = 0;
        local_3c2[0] = *(bool *)((long)&pnVar12[iVar11].m_backend.m_value + 0x16);
        uVar7 = *(uint *)((long)&pnVar12[iVar11].m_backend.m_value + 0x10);
        local_3c8 = 0;
        if (local_3c2[0] != false) {
          local_3c8 = uVar7;
        }
        local_3c4 = CONCAT11(local_3c2[0],*(bool *)((long)&pnVar12[iVar11].m_backend.m_value + 0x14)
                            ) ^ 0x100;
        if (local_3c2[0] == true) {
          local_3d8.la[0] = *(undefined8 *)&(pnVar1->m_backend).m_value;
          local_3d8.ld.data = (limb_pointer)*(undefined8 *)((long)&(pnVar1->m_backend).m_value + 8);
        }
        else {
          boost::multiprecision::backends::
          cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    *)&local_3d8.ld,uVar7,uVar7);
          uVar6 = &local_3d8;
          if (local_3c4._1_1_ == '\0') {
            uVar6 = local_3d8.ld.data;
          }
          pnVar12 = pnVar1;
          if (*(bool *)((long)&(pnVar1->m_backend).m_value + 0x15) == false) {
            pnVar12 = *(pointer *)((long)&(pnVar1->m_backend).m_value + 8);
          }
          memcpy((void *)uVar6,pnVar12,
                 (ulong)*(uint *)((long)&(pnVar1->m_backend).m_value + 0x10) << 3);
        }
        local_418.la[0] = (limb_type)&local_348;
        local_418.ld.data = (limb_pointer)&local_3d8;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
        ::
        number<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,void,void>
                  ((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
                    *)&local_2f8.ld,
                   (expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)&local_418.ld,(type *)0x0);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)(local_a0.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + iVar11),
                    (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)&local_2f8.ld);
        if ((abStack_2e3[0] == false) && (abStack_2e3[1] == false)) {
          operator_delete(local_2f8.ld.data,(local_2f8.la[0] & 0xffffffff) << 3);
        }
        local_378 = uVar16;
        if ((local_3c4._1_1_ == '\0') && (local_3c2[0] == false)) {
          operator_delete(local_3d8.ld.data,(local_3d8.la[0] & 0xffffffff) << 3);
        }
        pnVar15 = local_a0.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + iVar11;
        pnVar1 = (local_370->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar10 = (number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                   *)((long)&pnVar1[iVar11].m_backend.m_value + 0x20);
        local_3d8.la[0] = 0;
        local_3c2[0] = *(bool *)((long)&pnVar1[iVar11].m_backend.m_value + 0x36);
        uVar7 = *(uint *)((long)&pnVar1[iVar11].m_backend.m_value + 0x30);
        local_3c8 = 0;
        if (local_3c2[0] != false) {
          local_3c8 = uVar7;
        }
        local_3c4 = CONCAT11(local_3c2[0],*(bool *)((long)&pnVar1[iVar11].m_backend.m_value + 0x34))
                    ^ 0x100;
        if (local_3c2[0] == true) {
          local_3d8.la[0] =
               *(undefined8 *)
                &(pnVar10->m_backend).
                 super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          ;
          local_3d8.ld.data =
               (limb_pointer)*(undefined8 *)((long)&pnVar1[iVar11].m_backend.m_value + 0x28);
        }
        else {
          boost::multiprecision::backends::
          cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    *)&local_3d8.ld,uVar7,uVar7);
          uVar6 = &local_3d8;
          if (local_3c4._1_1_ == '\0') {
            uVar6 = local_3d8.ld.data;
          }
          if (*(bool *)((long)&pnVar1[iVar11].m_backend.m_value + 0x35) == false) {
            pnVar10 = *(number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                        **)((long)&pnVar1[iVar11].m_backend.m_value + 0x28);
          }
          memcpy((void *)uVar6,pnVar10,
                 (ulong)*(uint *)((long)&pnVar1[iVar11].m_backend.m_value + 0x30) << 3);
        }
        local_418.ld.data = (limb_pointer)&local_3d8;
        local_418.la[0] = (limb_type)pnVar15;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
        ::
        number<boost::multiprecision::detail::divide_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,void,void>
                  ((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
                    *)&local_2f8.ld,
                   (expression<boost::multiprecision::detail::divide_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)&local_418.ld,(type *)0x0);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)(local_a0.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + iVar11),
                    (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)&local_2f8.ld);
        uVar16 = local_378;
        if ((abStack_2e3[0] == false) && (abStack_2e3[1] == false)) {
          operator_delete(local_2f8.ld.data,(local_2f8.la[0] & 0xffffffff) << 3);
        }
        if ((local_3c4._1_1_ == '\0') && (local_3c2[0] == false)) {
          operator_delete(local_3d8.ld.data,(local_3d8.la[0] & 0xffffffff) << 3);
        }
        uVar16 = uVar16 + 1;
      } while ((long)uVar16 < (long)(local_230->super_IdxSet).num);
    }
  }
  pRVar17 = local_1d0;
  local_168.la[0] = 0;
  local_158 = 0;
  if (local_332 != 0) {
    local_158 = local_338;
  }
  local_154 = (undefined1)local_334;
  local_153 = local_332 ^ 1;
  local_152 = local_332;
  if (local_332 == 1) {
    local_168.la[0] = local_348.la[0];
    local_168.ld.data = local_348.ld.data;
  }
  else {
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              *)&local_168.ld,local_338,local_338);
    uVar6 = &local_168;
    if (local_153 == 0) {
      uVar6 = local_168.ld.data;
    }
    uVar14 = local_348.ld.data;
    if (local_334._1_1_ != '\0') {
      uVar14 = &local_348;
    }
    memcpy((void *)uVar6,(void *)uVar14,(ulong)local_338 << 3);
  }
  local_368.la[0] = 0;
  local_358 = 1;
  local_354 = 0x100;
  local_352 = '\0';
  local_278.la[0] = 0;
  local_268 = 1;
  local_264 = 0x100;
  local_262 = 0;
  local_318._0_8_ = 0;
  local_308 = 1;
  local_304._0_1_ = false;
  local_304._1_1_ = true;
  local_302[0] = false;
  local_258.la[0] = 0;
  local_248 = 1;
  local_244 = 0x100;
  local_242 = '\0';
  local_228.la[0] = 1;
  local_218 = 1;
  local_214 = 0x100;
  local_212 = 0;
  local_3d8.la[0] = 0;
  local_3c2[0] = (pRVar17->m_backend).m_value.num.m_backend.
                 super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 .m_alias;
  uVar7 = (pRVar17->m_backend).m_value.num.m_backend.
          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          .m_limbs;
  local_3c8 = 0;
  if (local_3c2[0] != false) {
    local_3c8 = uVar7;
  }
  local_3c4 = CONCAT11(local_3c2[0],
                       (pRVar17->m_backend).m_value.num.m_backend.
                       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                       .m_sign) ^ 0x100;
  if (local_3c2[0] == true) {
    local_3d8.la[0] =
         (pRVar17->m_backend).m_value.num.m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_data.la[0];
    local_3d8.ld.data =
         (pRVar17->m_backend).m_value.num.m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_data.ld.data;
  }
  else {
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              *)&local_3d8.ld,uVar7,uVar7);
    uVar6 = &local_3d8;
    if (local_3c4._1_1_ == '\0') {
      uVar6 = local_3d8.ld.data;
    }
    __src_00 = pRVar17;
    if ((pRVar17->m_backend).m_value.num.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_internal == false) {
      __src_00 = (Rational *)
                 (pRVar17->m_backend).m_value.num.m_backend.
                 super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 .m_data.ld.data;
    }
    memcpy((void *)uVar6,__src_00,
           (ulong)(pRVar17->m_backend).m_value.num.m_backend.
                  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  .m_limbs << 3);
  }
  pnVar10 = &(pRVar17->m_backend).m_value.den;
  local_418.la[0] = 0;
  local_402 = (pRVar17->m_backend).m_value.den.m_backend.
              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              .m_alias;
  uVar7 = (pRVar17->m_backend).m_value.den.m_backend.
          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          .m_limbs;
  local_408 = 0;
  if ((bool)local_402 != false) {
    local_408 = uVar7;
  }
  local_404 = CONCAT11(local_402,
                       (pRVar17->m_backend).m_value.den.m_backend.
                       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                       .m_sign) ^ 0x100;
  if ((bool)local_402 == true) {
    local_418.la[0] =
         (pnVar10->m_backend).
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_data.la[0];
    local_418.ld.data =
         (pRVar17->m_backend).m_value.den.m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_data.ld.data;
  }
  else {
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              *)&local_418.ld,uVar7,uVar7);
    uVar6 = &local_418;
    if (local_404._1_1_ == '\0') {
      uVar6 = local_418.ld.data;
    }
    if ((pRVar17->m_backend).m_value.den.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_internal == false) {
      pnVar10 = (number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                 *)(pRVar17->m_backend).m_value.den.m_backend.
                   super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                   .m_data.ld.data;
    }
    memcpy((void *)uVar6,pnVar10,
           (ulong)(pRVar17->m_backend).m_value.den.m_backend.
                  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  .m_limbs << 3);
  }
  local_88.la[0] = (limb_type)&local_3d8;
  local_88.ld.data = (limb_pointer)&local_418;
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
  ::
  number<boost::multiprecision::detail::divide_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,void,void>
            ((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
              *)&local_2f8.ld,
             (expression<boost::multiprecision::detail::divide_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
              *)&local_88.ld,(type *)0x0);
  boost::multiprecision::backends::
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               *)&local_258.ld,
              (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               *)&local_2f8.ld);
  if ((abStack_2e3[0] == false) && (abStack_2e3[1] == false)) {
    operator_delete(local_2f8.ld.data,(local_2f8.la[0] & 0xffffffff) << 3);
  }
  if ((local_404._1_1_ == '\0') && (local_402 == '\0')) {
    operator_delete(local_418.ld.data,(local_418.la[0] & 0xffffffff) << 3);
  }
  if ((local_3c4._1_1_ == '\0') && (local_3c2[0] == false)) {
    operator_delete(local_3d8.ld.data,(local_3d8.la[0] & 0xffffffff) << 3);
  }
  local_3d8.la[0] = 0;
  local_3c8 = 1;
  local_3c4._0_1_ = '\0';
  local_3c4._1_1_ = '\x01';
  local_3c2[0] = false;
  local_2f8.la[0] = 0;
  local_2e8 = 1;
  local_2e4 = 0;
  abStack_2e3[0] = true;
  abStack_2e3[1] = false;
  boost::multiprecision::default_ops::
  eval_integer_sqrt<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
            ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
              *)&local_3d8.ld,
             (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
              *)&local_2f8.ld,
             (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
              *)&local_258.ld);
  if ((abStack_2e3[0] == false) && (abStack_2e3[1] == false)) {
    operator_delete(local_2f8.ld.data,(local_2f8.la[0] & 0xffffffff) << 3);
  }
  boost::multiprecision::backends::
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               *)&local_258.ld,
              (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               *)&local_3d8.ld);
  if ((local_3c4._1_1_ == '\0') && (local_3c2[0] == false)) {
    operator_delete(local_3d8.ld.data,(local_3d8.la[0] & 0xffffffff) << 3);
  }
  if ((char)local_244 == '\0') {
    if (1 < local_248) goto LAB_0034f836;
    uVar6 = &local_258;
    if (local_244._1_1_ == '\0') {
      uVar6 = local_258.ld.data;
    }
    if (0xffffff < ((data_type *)&((limb_data *)uVar6)->capacity)->la[0]) goto LAB_0034f836;
  }
  boost::multiprecision::backends::
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            *)&local_258.ld,1,1);
  uVar6 = &local_258;
  if (local_244._1_1_ == '\0') {
    uVar6 = local_258.ld.data;
  }
  ((data_type *)&((limb_data *)uVar6)->capacity)->la[0] = 0x1000000;
  local_244 = local_244 & 0xff00;
LAB_0034f836:
  local_1f8.la[0] = 0;
  local_1e8 = 1;
  local_1e4 = 0x100;
  local_1e2 = '\0';
  local_298.la[0] = 0;
  local_288 = 1;
  local_284 = 0x100;
  local_282 = '\0';
  lVar9 = 0x16;
  do {
    *(undefined8 *)(local_318 + lVar9 + 10) = 0;
    *(undefined4 *)((long)&uStack_2fe + lVar9) = 1;
    *(undefined2 *)((long)&uStack_2fa + lVar9) = 0x100;
    *(undefined1 *)((long)&local_2f8 + lVar9) = 0;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0x76);
  lVar9 = 0x16;
  do {
    *(undefined8 *)(local_3f8 + lVar9 + 10) = 0;
    *(undefined4 *)((long)&uStack_3de + lVar9) = 1;
    *(undefined2 *)((long)&uStack_3da + lVar9) = 0x100;
    *(undefined1 *)((long)&local_3d8 + lVar9) = 0;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0x76);
  this = (data_type *)(local_3c2 + 10);
  local_48 = (long)(int)local_320;
  local_200 = CONCAT44(local_200._4_4_,(int)CONCAT71((int7)(int3)(local_320 >> 8),1));
  uVar16 = 0;
  local_1d0 = (Rational *)
              local_a0.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pRVar17 = (Rational *)
            local_a0.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (((local_230 != (DIdxSet *)0x0) || (local_48 <= (long)uVar16)) &&
       ((local_230 == (DIdxSet *)0x0 || ((long)(local_230->super_IdxSet).num <= (long)uVar16))))
    break;
    local_320 = uVar16;
    if (local_230 == (DIdxSet *)0x0) {
      iVar11 = (int)uVar16;
    }
    else {
      iVar11 = (local_230->super_IdxSet).idx[uVar16];
    }
    local_378 = (ulong)iVar11;
    o = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         *)((long)pRVar17 + local_378 * 0x20);
    if (((((pointer)((long)pRVar17 + local_378 * 0x20))->m_backend).
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_sign == false) &&
       ((((pointer)((long)pRVar17 + local_378 * 0x20))->m_backend).
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_limbs == 1)) {
      pcVar4 = o;
      if (o->m_internal == false) {
        pcVar4 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)(o->m_data).la[1];
      }
      if ((pcVar4->m_data).la[0] != 0) goto LAB_0034f9a5;
LAB_0034fce8:
      cVar2 = '\x01';
    }
    else {
LAB_0034f9a5:
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)local_318,o);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_278.ld,
               (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_168.ld);
      local_148.la[0] = 0;
      local_138 = 0;
      if (local_302[0] != false) {
        local_138 = local_308;
      }
      local_134 = local_304._0_1_;
      local_133 = local_302[0] ^ 1;
      local_132 = local_302[0];
      if (local_302[0] == true) {
        local_148.la[0] = local_318._0_8_;
        local_148.ld.data = (limb_pointer)local_318._8_8_;
      }
      else {
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_148.ld,local_308,local_308);
        uVar6 = &local_148;
        if (local_133 == 0) {
          uVar6 = local_148.ld.data;
        }
        pdVar5 = (data_type *)local_318;
        if (local_304._1_1_ == false) {
          pdVar5 = (data_type *)local_318._8_8_;
        }
        memcpy((void *)uVar6,pdVar5,(ulong)local_308 << 3);
      }
      local_188.la[0] = 0;
      local_178 = 0;
      if (local_262 != 0) {
        local_178 = local_268;
      }
      local_174 = (char)local_264;
      local_173 = local_262 ^ 1;
      local_172 = local_262;
      if (local_262 == 1) {
        local_188.la[0] = local_278.la[0];
        local_188.ld.data = local_278.ld.data;
      }
      else {
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_188.ld,local_268,local_268);
        uVar6 = &local_188;
        if (local_173 == 0) {
          uVar6 = local_188.ld.data;
        }
        uVar14 = &local_278;
        if (local_264._1_1_ == '\0') {
          uVar14 = local_278.ld.data;
        }
        memcpy((void *)uVar6,(void *)uVar14,(ulong)local_268 << 3);
      }
      boost::multiprecision::backends::
      eval_gcd<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_368.ld,
                 (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_148.ld,
                 (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_188.ld);
      if ((local_173 == 0) && (local_172 == 0)) {
        operator_delete(local_188.ld.data,(local_188.la[0] & 0xffffffff) << 3);
      }
      if ((local_133 == 0) && (local_132 == 0)) {
        operator_delete(local_148.ld.data,(local_148.la[0] & 0xffffffff) << 3);
      }
      local_418.la[0] = (limb_type)local_318;
      local_418.ld.data = (limb_pointer)&local_368;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
      ::
      do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::divide_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,void,void>>
                ((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
                  *)local_418.la[0],
                 (expression<boost::multiprecision::detail::divide_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                  *)&local_418.ld,(divide_immediates *)&local_88.ld);
      local_418._0_8_ = &local_278;
      local_418.ld.data = (limb_pointer)&local_368;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
      ::
      do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::divide_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,void,void>>
                ((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
                  *)&local_278.ld,
                 (expression<boost::multiprecision::detail::divide_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                  *)&local_418.ld,(divide_immediates *)&local_88.ld);
      cVar2 = (char)local_264;
      if ((char)local_264 == (char)local_244) {
        iVar3 = boost::multiprecision::backends::
                cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                ::
                compare_unsigned<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                          ((cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                            *)&local_278.ld,
                           (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                            *)&local_258.ld);
        iVar11 = -iVar3;
        if ((char)local_264 == '\0') {
          iVar11 = iVar3;
        }
        cVar2 = iVar11 < 1;
      }
      if (cVar2 != '\0') {
        local_418.la[0] = 0;
        local_408 = 1;
        local_404 = 0x100;
        local_402 = '\0';
        local_3f8._0_8_ = 1;
        local_3e8 = 1;
        local_3e4._0_1_ = false;
        local_3e4._1_1_ = true;
        local_3e2[0] = false;
        boost::
        rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
        ::
        assign<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                  ((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
                    *)&local_418.ld,
                   (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)local_318,
                   (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)&local_278.ld);
        uVar16 = local_378;
        pnVar1 = (local_370->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)(pnVar1 + local_378),
                    (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)&local_418.ld);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)((long)&pnVar1[uVar16].m_backend.m_value + 0x20),
                    (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)local_3f8);
        if ((local_3e4._1_1_ == false) && (local_3e2[0] == false)) {
          operator_delete((void *)local_3f8._8_8_,(local_3f8._0_8_ & 0xffffffff) << 3);
        }
        pRVar17 = local_1d0;
        if ((local_404._1_1_ == '\0') && (local_402 == '\0')) {
          operator_delete(local_418.ld.data,(local_418.la[0] & 0xffffffff) << 3);
        }
        goto LAB_0034fce8;
      }
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_368.ld,1,1);
      uVar6 = &local_368;
      if (local_354._1_1_ == '\0') {
        uVar6 = local_368.ld.data;
      }
      ((data_type *)&((limb_data *)uVar6)->capacity)->la[0] = 1;
      local_354 = local_354 & 0xff00;
      boost::multiprecision::backends::
      divide_unsigned_helper<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_1f8.ld,
                 (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)local_318,
                 (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_278.ld,
                 (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_368.ld);
      local_1e4 = CONCAT11(local_1e4._1_1_,local_304._0_1_ != (bool)(char)local_264);
      if ((local_304._0_1_ != (bool)(char)local_264) && (local_1e8 == 1)) {
        uVar6 = &local_1f8;
        if (local_1e4._1_1_ == 0) {
          uVar6 = local_1f8.ld.data;
        }
        if (*(limb_type *)uVar6 == 0) {
          local_1e4 = (ushort)local_1e4._1_1_ << 8;
        }
      }
      local_354._0_1_ = local_304._0_1_;
      if ((local_304._0_1_ != false) && (local_358 == 1)) {
        uVar6 = &local_368;
        if (local_354._1_1_ == 0) {
          uVar6 = local_368.ld.data;
        }
        if (((data_type *)&((limb_data *)uVar6)->capacity)->la[0] == 0) {
          local_354._0_1_ = '\0';
        }
      }
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)local_318,
               (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_278.ld);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_278.ld,
               (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_368.ld);
      boost::multiprecision::backends::
      divide_unsigned_helper<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_298.ld,
                 (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)local_318,
                 (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_278.ld,
                 (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_368.ld);
      local_284 = CONCAT11(local_284._1_1_,local_304._0_1_ != (bool)(char)local_264);
      if ((local_304._0_1_ != (bool)(char)local_264) && (local_288 == 1)) {
        uVar6 = &local_298;
        if (local_284._1_1_ == 0) {
          uVar6 = local_298.ld.data;
        }
        if (*(limb_type *)uVar6 == 0) {
          local_284 = (ushort)local_284._1_1_ << 8;
        }
      }
      local_354 = CONCAT11(local_354._1_1_,local_304._0_1_);
      if ((local_304._0_1_ != false) && (local_358 == 1)) {
        uVar6 = &local_368;
        if (local_354._1_1_ == 0) {
          uVar6 = local_368.ld.data;
        }
        if (((data_type *)&((limb_data *)uVar6)->capacity)->la[0] == 0) {
          local_354 = (ushort)local_354._1_1_ << 8;
        }
      }
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)local_318,
               (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_278.ld);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_278.ld,
               (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_368.ld);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)(abStack_2e3 + 0xb),
               (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_1f8.ld);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::resize(&local_2b8,1,1);
      uVar6 = &local_2b8;
      if (local_2b8.m_internal == false) {
        uVar6 = local_2b8.m_data.ld.data;
      }
      (((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         *)uVar6)->m_data).la[0] = 1;
      local_2b8.m_sign = false;
      local_418.la[0] = (limb_type)&local_1f8;
      local_418.ld.data = (limb_pointer)&local_298;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
      ::operator+=((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
                    *)&local_2b8,
                   (expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)&local_418.ld);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&this->ld,1,1);
      pdVar5 = this;
      if (local_3a3 == '\0') {
        pdVar5 = (data_type *)local_3b8._8_8_;
      }
      ((data_type *)&(pdVar5->ld).capacity)->la[0] = 1;
      local_3a4 = '\0';
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign(&local_398,
               (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_298.ld);
      cVar2 = local_398.m_sign;
      if (local_398.m_sign == (bool)(char)local_244) {
        iVar3 = boost::multiprecision::backends::
                cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                ::
                compare_unsigned<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                          ((cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                            *)&local_398,
                           (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                            *)&local_258.ld);
        iVar11 = -iVar3;
        if (local_398.m_sign == false) {
          iVar11 = iVar3;
        }
        cVar2 = iVar11 < 1;
      }
      while (cVar2 != '\0') {
        if (((char)local_264 == '\0') && (local_268 == 1)) {
          uVar6 = &local_278;
          if (local_264._1_1_ == '\0') {
            uVar6 = local_278.ld.data;
          }
          if (((data_type *)&((limb_data *)uVar6)->capacity)->la[0] == 0) break;
        }
        boost::multiprecision::backends::
        divide_unsigned_helper<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                  ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)&local_298.ld,
                   (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)local_318,
                   (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)&local_278.ld,
                   (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)&local_368.ld);
        local_284 = CONCAT11(local_284._1_1_,local_304._0_1_ != (bool)(char)local_264);
        if ((local_304._0_1_ != (bool)(char)local_264) && (local_288 == 1)) {
          uVar6 = &local_298;
          if (local_284._1_1_ == 0) {
            uVar6 = local_298.ld.data;
          }
          if (*(limb_type *)uVar6 == 0) {
            local_284 = (ushort)local_284._1_1_ << 8;
          }
        }
        local_354 = CONCAT11(local_354._1_1_,local_304._0_1_);
        if ((local_304._0_1_ != false) && (local_358 == 1)) {
          uVar6 = &local_368;
          if (local_354._1_1_ == 0) {
            uVar6 = local_368.ld.data;
          }
          if (((data_type *)&((limb_data *)uVar6)->capacity)->la[0] == 0) {
            local_354 = (ushort)local_354._1_1_ << 8;
          }
        }
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)local_318,
                 (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_278.ld);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_278.ld,
                 (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_368.ld);
        local_3c8 = 0;
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_3d8.ld,local_3a8,local_3a8);
        uVar6 = &local_3d8;
        if (local_3c4._1_1_ == '\0') {
          uVar6 = local_3d8.ld.data;
        }
        pdVar5 = this;
        if (local_3a3 == '\0') {
          pdVar5 = (data_type *)local_3b8._8_8_;
        }
        memcpy((void *)uVar6,pdVar5,(ulong)local_3a8 << 3);
        local_3c4._0_1_ = local_3a4;
        local_3a8 = 0;
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&this->ld,local_398.m_limbs,local_398.m_limbs);
        pdVar5 = this;
        if (local_3a3 == '\0') {
          pdVar5 = (data_type *)local_3b8._8_8_;
        }
        uVar6 = &local_398;
        if (local_398.m_internal == false) {
          uVar6 = local_398.m_data.ld.data;
        }
        memcpy(pdVar5,(void *)uVar6,(ulong)local_398.m_limbs << 3);
        local_3a4 = local_398.m_sign;
        local_2e8 = 0;
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_2f8.ld,local_2c8,local_2c8);
        uVar6 = &local_2f8;
        if (abStack_2e3[0] == false) {
          uVar6 = local_2f8.ld.data;
        }
        pbVar13 = abStack_2e3 + 0xb;
        if (local_2c3 == '\0') {
          pbVar13 = local_2d0;
        }
        memcpy((void *)uVar6,pbVar13,(ulong)local_2c8 << 3);
        local_2e4 = local_2c4;
        local_2c8 = 0;
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)(abStack_2e3 + 0xb),local_2b8.m_limbs,local_2b8.m_limbs);
        pbVar13 = abStack_2e3 + 0xb;
        if (local_2c3 == '\0') {
          pbVar13 = local_2d0;
        }
        uVar6 = &local_2b8;
        if (local_2b8.m_internal == false) {
          uVar6 = local_2b8.m_data.ld.data;
        }
        memcpy(pbVar13,(void *)uVar6,(ulong)local_2b8.m_limbs << 3);
        local_2c4 = local_2b8.m_sign;
        local_2b8.m_limbs = 0;
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::resize(&local_2b8,local_2e8,local_2e8);
        uVar6 = &local_2b8;
        if (local_2b8.m_internal == false) {
          uVar6 = local_2b8.m_data.ld.data;
        }
        uVar14 = &local_2f8;
        if (abStack_2e3[0] == false) {
          uVar14 = local_2f8.ld.data;
        }
        memcpy((void *)uVar6,(void *)uVar14,(ulong)local_2e8 << 3);
        local_2b8.m_sign = (bool)local_2e4;
        local_418.la[0] = (limb_type)(abStack_2e3 + 0xb);
        local_418.ld.data = (limb_pointer)&local_298;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
        ::operator+=((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
                      *)&local_2b8,
                     (expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                      *)&local_418.ld);
        local_398.m_limbs = 0;
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::resize(&local_398,local_3c8,local_3c8);
        uVar6 = &local_398;
        if (local_398.m_internal == false) {
          uVar6 = local_398.m_data.ld.data;
        }
        uVar14 = &local_3d8;
        if (local_3c4._1_1_ == '\0') {
          uVar14 = local_3d8.ld.data;
        }
        memcpy((void *)uVar6,(void *)uVar14,(ulong)local_3c8 << 3);
        local_398.m_sign = (bool)(char)local_3c4;
        local_418.ld.data = (limb_pointer)&local_298;
        local_418._0_8_ = this;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
        ::operator+=((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
                      *)&local_398,
                     (expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                      *)&local_418.ld);
        cVar2 = local_398.m_sign;
        if (local_398.m_sign == (bool)(char)local_244) {
          iVar3 = boost::multiprecision::backends::
                  cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                  ::
                  compare_unsigned<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                            ((cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                              *)&local_398,
                             (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                              *)&local_258.ld);
          iVar11 = -iVar3;
          if (local_398.m_sign == false) {
            iVar11 = iVar3;
          }
          cVar2 = iVar11 < 1;
        }
      }
      if (local_3a4 == '\0') {
        local_418.la[0] = 0;
        local_408 = 1;
        local_404 = 0x100;
        local_402 = '\0';
        local_3f8._0_8_ = 1;
        local_3e8 = 1;
        local_3e4._0_1_ = false;
        local_3e4._1_1_ = true;
        local_3e2[0] = false;
        boost::
        rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
        ::
        assign<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                  ((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
                    *)&local_418.ld,
                   (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)(abStack_2e3 + 0xb),
                   (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)&this->ld);
        uVar16 = local_378;
        pnVar1 = (local_370->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)(pnVar1 + local_378),
                    (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)&local_418.ld);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)((long)&pnVar1[uVar16].m_backend.m_value + 0x20),
                    (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)local_3f8);
        if ((local_3e4._1_1_ == false) && (local_3e2[0] == false)) {
          operator_delete((void *)local_3f8._8_8_,(local_3f8._0_8_ & 0xffffffff) << 3);
        }
        if ((local_404._1_1_ == '\0') && (local_402 == '\0')) {
          operator_delete(local_418.ld.data,(local_418.la[0] & 0xffffffff) << 3);
        }
      }
      else {
        local_38.arg = (type)(abStack_2e3 + 0xb);
        local_418.la[0] = 0;
        local_408 = 1;
        local_404 = 0x100;
        local_402 = '\0';
        local_3f8._0_8_ = 1;
        local_3e8 = 1;
        local_3e4._0_1_ = false;
        local_3e4._1_1_ = true;
        local_3e2[0] = false;
        local_40.arg = (type)this;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
        ::
        number<boost::multiprecision::detail::negate,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,void,void,void>
                  ((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
                    *)&local_88.ld,&local_38,(type *)0x0);
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
        ::
        number<boost::multiprecision::detail::negate,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,void,void,void>
                  ((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
                    *)local_68,&local_40,(type *)0x0);
        boost::
        rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
        ::
        assign<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                  ((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
                    *)&local_418.ld,
                   (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)&local_88.ld,
                   (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)local_68);
        if ((local_53 == '\0') && (local_52 == '\0')) {
          operator_delete(local_60,(ulong)local_68[0] << 3);
        }
        if ((local_73 == '\0') && (local_72 == '\0')) {
          operator_delete(local_88.ld.data,(local_88.la[0] & 0xffffffff) << 3);
        }
        uVar16 = local_378;
        pnVar1 = (local_370->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)(pnVar1 + local_378),
                    (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)&local_418.ld);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)((long)&pnVar1[uVar16].m_backend.m_value + 0x20),
                    (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)local_3f8);
        if ((local_3e4._1_1_ == false) && (local_3e2[0] == false)) {
          operator_delete((void *)local_3f8._8_8_,(local_3f8._0_8_ & 0xffffffff) << 3);
        }
        if ((local_404._1_1_ == '\0') && (local_402 == '\0')) {
          operator_delete(local_418.ld.data,(local_418.la[0] & 0xffffffff) << 3);
        }
      }
      local_1a8.la[0] = 0;
      local_198 = 0;
      if (local_212 != 0) {
        local_198 = local_218;
      }
      local_194 = (char)local_214;
      local_193 = local_212 ^ 1;
      local_192 = local_212;
      if (local_212 == 1) {
        local_1a8.la[0] = local_228.la[0];
        local_1a8.ld.data = local_228.ld.data;
      }
      else {
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_1a8.ld,local_218,local_218);
        uVar6 = &local_1a8;
        if (local_193 == 0) {
          uVar6 = local_1a8.ld.data;
        }
        uVar14 = &local_228;
        if (local_214._1_1_ == '\0') {
          uVar14 = local_228.ld.data;
        }
        memcpy((void *)uVar6,(void *)uVar14,(ulong)local_218 << 3);
      }
      pnVar1 = (local_370->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar10 = (number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                 *)((long)&pnVar1[local_378].m_backend.m_value + 0x20);
      local_1c8.la[0] = 0;
      local_1b2 = *(bool *)((long)&pnVar1[local_378].m_backend.m_value + 0x36);
      uVar7 = *(uint *)((long)&pnVar1[local_378].m_backend.m_value + 0x30);
      local_1b8 = 0;
      if ((bool)local_1b2 != false) {
        local_1b8 = uVar7;
      }
      local_1b4 = *(bool *)((long)&pnVar1[local_378].m_backend.m_value + 0x34);
      local_1b3 = local_1b2 ^ 1;
      if ((bool)local_1b2 == true) {
        local_1c8.la[0] =
             *(undefined8 *)
              &(pnVar10->m_backend).
               super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ;
        local_1c8.ld.data =
             (limb_pointer)*(undefined8 *)((long)&pnVar1[local_378].m_backend.m_value + 0x28);
        local_378 = local_378 * 0x40;
      }
      else {
        local_378 = local_378 * 0x40;
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_1c8.ld,uVar7,uVar7);
        uVar6 = &local_1c8;
        if (local_1b3 == 0) {
          uVar6 = local_1c8.ld.data;
        }
        if (*(char *)((long)&(pnVar1->m_backend).m_value + local_378 + 0x35) == '\0') {
          pnVar10 = *(number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                      **)((long)&(pnVar1->m_backend).m_value + local_378 + 0x28);
        }
        memcpy((void *)uVar6,pnVar10,
               (ulong)*(uint *)((long)&(pnVar1->m_backend).m_value + local_378 + 0x30) << 3);
      }
      boost::multiprecision::backends::
      eval_gcd<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_368.ld,
                 (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_1a8.ld,
                 (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_1c8.ld);
      pRVar17 = local_1d0;
      if ((local_1b3 == 0) && (local_1b2 == 0)) {
        operator_delete(local_1c8.ld.data,(local_1c8.la[0] & 0xffffffff) << 3);
      }
      if ((local_193 == 0) && (local_192 == 0)) {
        operator_delete(local_1a8.ld.data,(local_1a8.la[0] & 0xffffffff) << 3);
      }
      boost::multiprecision::backends::
      eval_multiply<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>,0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>,0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_228.ld,
                 (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_228,
                 (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_368.ld);
      cVar2 = (char)local_214;
      if ((char)local_214 == (char)local_244) {
        iVar3 = boost::multiprecision::backends::
                cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                ::
                compare_unsigned<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                          ((cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                            *)&local_228.ld,
                           (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                            *)&local_258.ld);
        iVar11 = -iVar3;
        if ((char)local_214 == '\0') {
          iVar11 = iVar3;
        }
        cVar2 = iVar11 < 1;
      }
      uVar7 = (uint)local_200 & 0xff;
      if (cVar2 == '\0') {
        uVar7 = 0;
      }
      local_200 = CONCAT44(local_200._4_4_,uVar7);
    }
    uVar16 = local_320 + 1;
  } while (cVar2 != '\0');
  lVar9 = 0x60;
  do {
    if ((local_3e2[lVar9 + -1] == false) && (local_3e2[lVar9] == false)) {
      operator_delete(*(void **)(local_3f8 + lVar9 + 8),(ulong)*(uint *)(local_3f8 + lVar9) << 3);
    }
    lVar9 = lVar9 + -0x20;
  } while (lVar9 != 0);
  lVar9 = 0x60;
  do {
    if ((local_302[lVar9 + -1] == false) && (local_302[lVar9] == false)) {
      operator_delete(*(void **)(local_318 + lVar9 + 8),(ulong)*(uint *)(local_318 + lVar9) << 3);
    }
    lVar9 = lVar9 + -0x20;
  } while (lVar9 != 0);
  if ((local_284._1_1_ == '\0') && (local_282 == '\0')) {
    operator_delete(local_298.ld.data,(local_298.la[0] & 0xffffffff) << 3);
  }
  if ((local_1e4._1_1_ == '\0') && (local_1e2 == '\0')) {
    operator_delete(local_1f8.ld.data,(local_1f8.la[0] & 0xffffffff) << 3);
  }
  if ((local_214._1_1_ == '\0') && (local_212 == 0)) {
    operator_delete(local_228.ld.data,(local_228.la[0] & 0xffffffff) << 3);
  }
  if ((local_244._1_1_ == '\0') && (local_242 == '\0')) {
    operator_delete(local_258.ld.data,(local_258.la[0] & 0xffffffff) << 3);
  }
  if ((local_304._1_1_ == false) && (local_302[0] == false)) {
    operator_delete((void *)local_318._8_8_,(local_318._0_8_ & 0xffffffff) << 3);
  }
  if ((local_264._1_1_ == '\0') && (local_262 == 0)) {
    operator_delete(local_278.ld.data,(local_278.la[0] & 0xffffffff) << 3);
  }
  if ((local_354._1_1_ == '\0') && (local_352 == '\0')) {
    operator_delete(local_368.ld.data,(local_368.la[0] & 0xffffffff) << 3);
  }
  if ((local_153 == 0) && (local_152 == 0)) {
    operator_delete(local_168.ld.data,(local_168.la[0] & 0xffffffff) << 3);
  }
  if ((local_334._1_1_ == '\0') && (local_332 == 0)) {
    operator_delete(local_348.ld.data,(local_348.la[0] & 0xffffffff) << 3);
  }
  bVar8 = (byte)local_200;
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::~vector(&local_a0);
  return (bool)(bVar8 & 1);
}

Assistant:

inline bool reconstructVector(VectorRational& input, const Rational& denomBoundSquared,
                              const DIdxSet* indexSet)
{
   std::vector<Integer> xnum(input.dim()); /* numerator of input vector */
   Integer denom = 1; /* common denominator of input vector */
   int rval = true;
   int dim;

   dim = input.dim();

   /* find common denominator */
   if(indexSet == nullptr)
   {
      for(int i = 0; i < dim; i++)
         SpxLcm(denom, denom, denominator(input[i]));

      for(int i = 0; i < dim; i++)
      {
         xnum[i] = denom * Integer(numerator(input[i]));
         xnum[i] = xnum[i] / Integer(denominator(input[i]));
      }
   }
   else
   {
      for(int i = 0; i < indexSet->size(); i++)
      {
         assert(indexSet->index(i) >= 0);
         assert(indexSet->index(i) < input.dim());
         SpxLcm(denom, denom, denominator(input[indexSet->index(i)]));
      }

      for(int i = 0; i < indexSet->size(); i++)
      {
         int k = indexSet->index(i);
         assert(k >= 0);
         assert(k < input.dim());
         xnum[k] = denom * Integer(numerator(input[k]));
         xnum[k] = xnum[k] / Integer(denominator(input[k]));
      }
   }

   SPxOut::debug(&input, "LCM = {}\n", denom);

   /* reconstruct */
   rval = Reconstruct(input, xnum.data(), denom, dim, denomBoundSquared, indexSet);

   return rval;
}